

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_file.hpp
# Opt level: O0

int __thiscall io::posix::mmap_file::open(mmap_file *this,char *__file,int __oflag,...)

{
  bool bVar1;
  undefined7 extraout_var;
  system_error *this_00;
  uint in_ECX;
  error_code __ec;
  undefined1 auStack_30 [8];
  error_code ec;
  perms create_perms_local;
  open_mode mode_local;
  path *path_local;
  mmap_file *this_local;
  
  ec._M_cat._0_4_ = in_ECX;
  ec._M_cat._4_4_ = __oflag;
  std::error_code::error_code((error_code *)auStack_30);
  open(this,__file,ec._M_cat._4_4_,(ulong)(uint)ec._M_cat,auStack_30);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)auStack_30);
  if (!bVar1) {
    return (int)CONCAT71(extraout_var,bVar1);
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  __ec._0_8_ = (ulong)auStack_30 & 0xffffffff;
  __ec._M_cat = (error_category *)ec._0_8_;
  std::system_error::system_error(this_00,__ec);
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void open(const io_std::filesystem::path& path,
              open_mode mode,
              io_std::filesystem::perms create_perms = default_creation_perms)
    {
        std::error_code ec;
        this->open(path, mode, create_perms, ec);
        if (ec) {
            throw std::system_error{ec};
        }
    }